

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_read_utf8_char(sexp ctx,sexp port,int i)

{
  sexp psVar1;
  uint uVar2;
  uint uVar3;
  sexp psVar4;
  
  if (0x7f < i) {
    if (i - 0xf8U < 0xffffffc8) {
      psVar4 = sexp_user_exception(ctx,(sexp)0x0,"read-char: invalid utf8 byte",
                                   (sexp)(ulong)(i * 2 + 1));
      return psVar4;
    }
    if ((uint)i < 0xe0) {
      psVar4 = (port->value).type.setters;
      if (psVar4 == (sexp)0x0) {
        uVar2 = getc((FILE *)(port->value).type.getters);
      }
      else {
        psVar1 = (port->value).type.print;
        if (psVar1 < (sexp)(port->value).port.size) {
          (port->value).type.print = (sexp)((long)&psVar1->tag + 1);
          uVar2 = (uint)*(byte *)((long)&psVar1->tag + (long)&psVar4->tag);
        }
        else {
          uVar2 = sexp_buffered_read_char(ctx,port);
        }
      }
      i = uVar2 & 0x3f | (i & 0x3fU) << 6;
    }
    else {
      psVar4 = (port->value).type.setters;
      if ((uint)i < 0xf0) {
        if (psVar4 == (sexp)0x0) {
          uVar2 = getc((FILE *)(port->value).type.getters);
        }
        else {
          psVar1 = (port->value).type.print;
          if (psVar1 < (sexp)(port->value).port.size) {
            (port->value).type.print = (sexp)((long)&psVar1->tag + 1);
            uVar2 = (uint)*(byte *)((long)&psVar1->tag + (long)&psVar4->tag);
          }
          else {
            uVar2 = sexp_buffered_read_char(ctx,port);
          }
        }
        uVar2 = (uVar2 & 0x3f) << 6 | (i & 0x1fU) << 0xc;
      }
      else {
        if (psVar4 == (sexp)0x0) {
          uVar2 = getc((FILE *)(port->value).type.getters);
        }
        else {
          psVar1 = (port->value).type.print;
          if (psVar1 < (sexp)(port->value).port.size) {
            (port->value).type.print = (sexp)((long)&psVar1->tag + 1);
            uVar2 = (uint)*(byte *)((long)&psVar1->tag + (long)&psVar4->tag);
          }
          else {
            uVar2 = sexp_buffered_read_char(ctx,port);
          }
        }
        psVar4 = (port->value).type.setters;
        if (psVar4 == (sexp)0x0) {
          uVar3 = getc((FILE *)(port->value).type.getters);
        }
        else {
          psVar1 = (port->value).type.print;
          if (psVar1 < (sexp)(port->value).port.size) {
            (port->value).type.print = (sexp)((long)&psVar1->tag + 1);
            uVar3 = (uint)*(byte *)((long)&psVar1->tag + (long)&psVar4->tag);
          }
          else {
            uVar3 = sexp_buffered_read_char(ctx,port);
          }
        }
        uVar2 = (uVar2 & 0x3f) << 0xc | (i & 0xfU) << 0x12 | (uVar3 & 0x3f) << 6;
      }
      psVar4 = (port->value).type.setters;
      if (psVar4 == (sexp)0x0) {
        uVar3 = getc((FILE *)(port->value).type.getters);
      }
      else {
        psVar1 = (port->value).type.print;
        if (psVar1 < (sexp)(port->value).port.size) {
          (port->value).type.print = (sexp)((long)&psVar1->tag + 1);
          uVar3 = (uint)*(byte *)((long)&psVar1->tag + (long)&psVar4->tag);
        }
        else {
          uVar3 = sexp_buffered_read_char(ctx,port);
        }
      }
      i = uVar2 | uVar3 & 0x3f;
    }
  }
  return (sexp)((long)i << 8 | 0x1e);
}

Assistant:

sexp sexp_read_utf8_char (sexp ctx, sexp port, int i) {
  if (i >= 0x80) {
    if ((i < 0xC0) || (i > 0xF7)) {
      return sexp_user_exception(ctx, NULL, "read-char: invalid utf8 byte", sexp_make_fixnum(i));
    } else if (i < 0xE0) {
      i = ((i&0x3F)<<6) + (sexp_read_char(ctx, port)&0x3F);
    } else if (i < 0xF0) {
      i = ((i&0x1F)<<12) + ((sexp_read_char(ctx, port)&0x3F)<<6);
      i += sexp_read_char(ctx, port)&0x3F;
    } else {
      i = ((i&0x0F)<<18) + ((sexp_read_char(ctx, port)&0x3F)<<12);
      i += (sexp_read_char(ctx, port)&0x3F)<<6;
      i += sexp_read_char(ctx, port)&0x3F;
    }
  }
  return sexp_make_character(i);
}